

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBarLayout::setIconSize(ToolBarLayout *this,QSize *s)

{
  QArrayData *pQVar1;
  QLayoutItem **ppQVar2;
  long lVar3;
  ToolButton *this_00;
  long lVar4;
  
  pQVar1 = &((this->buttons).d.d)->super_QArrayData;
  ppQVar2 = (this->buttons).d.ptr;
  lVar3 = (this->buttons).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar3 != 0) {
    lVar4 = 0;
    do {
      (**(code **)(**(long **)((long)ppQVar2 + lVar4) + 0x68))();
      this_00 = (ToolButton *)QMetaObject::cast((QObject *)&ToolButton::staticMetaObject);
      if (this_00 != (ToolButton *)0x0) {
        ToolButton::setIconSize(this_00,s);
      }
      lVar4 = lVar4 + 8;
    } while (lVar3 << 3 != lVar4);
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,8,8);
    }
  }
  QLayout::update();
  return;
}

Assistant:

void
ToolBarLayout::setIconSize( const QSize & s )
{
	foreach( QLayoutItem * item, buttons )
	{
		ToolButton * b = qobject_cast< ToolButton* >
			( item->widget() );

		if( b )
			b->setIconSize( s );
	}

	update();
}